

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O0

bool __thiscall QFileSystemEntry::isAbsolute(QFileSystemEntry *this)

{
  bool bVar1;
  char16_t cVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_19;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  resolveFilePath(in_stack_ffffffffffffffc8);
  bVar1 = QString::isEmpty((QString *)0x123404);
  local_19 = false;
  if (!bVar1) {
    local_a = QString::at(in_RDI,CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    cVar2 = QChar::unicode(&local_a);
    local_19 = cVar2 == L'/';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEntry::isAbsolute() const
{
    resolveFilePath();
    return (!m_filePath.isEmpty() && (m_filePath.at(0).unicode() == '/'));
}